

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::geometry::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat)

{
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentDescription colorAttachmentDescription;
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference local_c8;
  VkAttachmentReference local_c0;
  VkAttachmentDescription local_b4;
  VkRenderPassCreateInfo local_90;
  VkSubpassDescription local_50;
  
  local_50.pDepthStencilAttachment = &local_c8;
  local_90.pAttachments = &local_b4;
  local_b4.flags = 0;
  local_b4.samples = VK_SAMPLE_COUNT_1_BIT;
  local_b4.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_b4.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_b4.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  local_b4.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_b4.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_b4.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_50.pColorAttachments = &local_c0;
  local_c0.attachment = 0;
  local_c0.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_c8.attachment = 0xffffffff;
  local_c8.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_90.pSubpasses = &local_50;
  local_50.flags = 0;
  local_50.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_50.inputAttachmentCount = 0;
  local_50.pInputAttachments = (VkAttachmentReference *)0x0;
  local_50.colorAttachmentCount = 1;
  local_50.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_50.preserveAttachmentCount = 0;
  local_50.pPreserveAttachments = (deUint32 *)0x0;
  local_90.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_90.pNext = (void *)0x0;
  local_90.flags = 0;
  local_90.attachmentCount = 1;
  local_90.subpassCount = 1;
  local_90.dependencyCount = 0;
  local_90.pDependencies = (VkSubpassDependency *)0x0;
  local_b4.format = colorFormat;
  ::vk::createRenderPass(__return_storage_ptr__,vk,device,&local_90,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface& vk, const VkDevice device, const VkFormat colorFormat)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,				// VkAttachmentDescriptionFlags		flags;
		colorFormat,									// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,							// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,					// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// VkAttachmentStoreOp				stencilStoreOp;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL		// VkImageLayout					finalLayout;
	};

	const VkAttachmentReference colorAttachmentReference =
	{
		0u,												// deUint32			attachment;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL		// VkImageLayout	layout;
	};

	const VkAttachmentReference depthAttachmentReference =
	{
		VK_ATTACHMENT_UNUSED,							// deUint32			attachment;
		VK_IMAGE_LAYOUT_UNDEFINED						// VkImageLayout	layout;
	};

	const VkSubpassDescription subpassDescription =
	{
		(VkSubpassDescriptionFlags)0,					// VkSubpassDescriptionFlags		flags;
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
		0u,												// deUint32							inputAttachmentCount;
		DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
		1u,												// deUint32							colorAttachmentCount;
		&colorAttachmentReference,						// const VkAttachmentReference*		pColorAttachments;
		DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
		&depthAttachmentReference,						// const VkAttachmentReference*		pDepthStencilAttachment;
		0u,												// deUint32							preserveAttachmentCount;
		DE_NULL											// const deUint32*					pPreserveAttachments;
	};

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		(VkRenderPassCreateFlags)0,						// VkRenderPassCreateFlags			flags;
		1u,												// deUint32							attachmentCount;
		&colorAttachmentDescription,					// const VkAttachmentDescription*	pAttachments;
		1u,												// deUint32							subpassCount;
		&subpassDescription,							// const VkSubpassDescription*		pSubpasses;
		0u,												// deUint32							dependencyCount;
		DE_NULL											// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}